

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall cmCacheManager::CacheEntry::RemoveProperty(CacheEntry *this,string *prop)

{
  bool bVar1;
  CacheEntryType CVar2;
  allocator<char> local_39;
  string local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *prop_local;
  CacheEntry *this_local;
  
  local_18 = prop;
  prop_local = &this->Value;
  bVar1 = std::operator==(prop,"TYPE");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"STRING",&local_39);
    CVar2 = cmState::StringToCacheEntryType(&local_38);
    this->Type = CVar2;
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    bVar1 = std::operator==(local_18,"VALUE");
    if (bVar1) {
      std::__cxx11::string::clear();
    }
    else {
      cmPropertyMap::RemoveProperty(&this->Properties,local_18);
    }
  }
  return;
}

Assistant:

void cmCacheManager::CacheEntry::RemoveProperty(const std::string& prop)
{
  if (prop == "TYPE") {
    this->Type = cmState::StringToCacheEntryType("STRING");
  } else if (prop == "VALUE") {
    this->Value.clear();
  } else {
    this->Properties.RemoveProperty(prop);
  }
}